

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_interpolator.hpp
# Opt level: O0

void ear::dsp::LinearInterpVector::apply_interp
               (float **in,float **out,SampleIndex range_start,SampleIndex range_end,
               SampleIndex block_start,SampleIndex start,SampleIndex end,Point *start_point,
               Point *end_point)

{
  float fVar1;
  float fVar2;
  size_type sVar3;
  const_reference pvVar4;
  float fVar5;
  float gain;
  float p;
  SampleIndex i;
  float e;
  float s;
  size_t channel;
  float scale;
  SampleIndex start_local;
  SampleIndex block_start_local;
  SampleIndex range_end_local;
  SampleIndex range_start_local;
  float **out_local;
  float **in_local;
  
  _e = 0;
  while( true ) {
    sVar3 = std::vector<float,_std::allocator<float>_>::size(start_point);
    if (sVar3 <= _e) break;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](start_point,_e);
    fVar1 = *pvVar4;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](end_point,_e);
    fVar2 = *pvVar4;
    for (_gain = range_start; _gain < range_end; _gain = _gain + 1) {
      fVar5 = (float)((block_start + _gain) - start) * (1.0 / (float)(end - start));
      out[_e][_gain] = (*in)[_gain] * ((1.0 - fVar5) * fVar1 + fVar5 * fVar2);
    }
    _e = _e + 1;
  }
  return;
}

Assistant:

static void apply_interp(const float *const *in, float *const *out,
                               SampleIndex range_start, SampleIndex range_end,
                               SampleIndex block_start, SampleIndex start,
                               SampleIndex end, const Point &start_point,
                               const Point &end_point) {
        float scale = 1.0f / (end - start);

        for (size_t channel = 0; channel < start_point.size(); channel++) {
          float s = start_point[channel];
          float e = end_point[channel];

          for (SampleIndex i = range_start; i < range_end; i++) {
            float p = (float)((block_start + i) - start) * scale;
            float gain = (1.0f - p) * s + p * e;
            out[channel][i] = in[0][i] * gain;
          }
        }
      }